

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_new_collisions::test_method(addrman_new_collisions *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  readonly_property65 rVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  CService *pCVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_01;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined4 uVar7;
  undefined4 uVar8;
  uint *puVar9;
  assertion_result *ar;
  char *pcVar10;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  allocator_type local_2c9;
  vector<CAddress,_std::allocator<CAddress>_> local_2c8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  uint32_t num_addrs;
  __single_object addrman;
  CService local_178;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  CService addr2;
  CService local_108;
  CService local_e0;
  undefined1 local_b8 [56];
  CService addr1;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b8,"252.2.2.2",(allocator<char> *)&addr1);
  ResolveIP(&source,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  num_addrs = 0;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x123;
  file.m_begin = (iterator)&local_198;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
  local_b8[8] = '\0';
  local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_1b0 = "";
  addr1.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar5 = &addr1;
  pcVar10 = "num_addrs";
  uVar7 = 0xb64cd2;
  uVar8 = 0;
  pvVar4 = (iterator)0x2;
  puVar9 = &num_addrs;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_1b8,0x123,1);
  while (num_addrs < 0x16) {
    num_addrs = num_addrs + 1;
    util::ToString<unsigned_int>((string *)&addr2,&num_addrs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   "250.1.1.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
    ResolveService(&addr1,(string *)local_b8,0);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&addr2);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x127;
    file_00.m_begin = (iterator)&local_1c8;
    msg_00.m_end = (iterator)pCVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
               msg_00);
    _Var2 = addrman;
    CService::CService(&local_e0,&addr1);
    ipIn.super_CNetAddr.m_addr._union._4_4_ = uVar8;
    ipIn.super_CNetAddr.m_addr._union._0_4_ = uVar7;
    ipIn.super_CNetAddr.m_addr._union._8_8_ = puVar9;
    ipIn.super_CNetAddr.m_addr._16_8_ = pcVar10;
    ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffce0;
    ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
    ipIn._32_8_ = in_stack_fffffffffffffce8;
    CAddress::CAddress((CAddress *)local_b8,ipIn,(ServiceFlags)&local_e0);
    __l._M_len = 1;
    __l._M_array = (CAddress *)local_b8;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0,__l,
               (allocator_type *)&local_2e0);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         AddrMan::Add((AddrMan *)
                      _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                      super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                      (vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0,&source,(seconds)0x0
                     );
    local_150[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_150._8_8_ = (element_type *)0x0;
    aStack_140._M_allocated_capacity = 0;
    local_2c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xb65669;
    local_2c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xb6569a;
    addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)&PTR__lazy_ostream_011481f0;
    addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr2.super_CNetAddr._24_8_ = &local_2c8;
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_1f8 = "";
    pvVar4 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_150,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar9,
               (size_t)&local_200,0x127);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_e0);
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_208 = "";
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x12a;
    file_01.m_begin = (iterator)&local_210;
    msg_01.m_end = pvVar6;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_220,
               msg_01);
    local_b8[8] = '\0';
    local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
    local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_230 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_228 = "";
    addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)AddrMan::Size((AddrMan *)
                               addrman._M_t.
                               super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                               super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                               super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                               (optional<Network>)0x0,(optional<bool>)0x0);
    pcVar10 = "num_addrs";
    uVar7 = 0xb64cd2;
    uVar8 = 0;
    pvVar4 = (iterator)0x2;
    pCVar5 = &addr2;
    puVar9 = &num_addrs;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((CAddress *)local_b8,&local_230,0x12a,1);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  }
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)&addr2,&num_addrs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "250.1.1.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  ResolveService(&addr1,(string *)local_b8,0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&addr2);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x130;
  file_02.m_begin = (iterator)&local_240;
  msg_02.m_end = (iterator)pCVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_250,
             msg_02);
  _Var2 = addrman;
  CService::CService(&local_108,&addr1);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = uVar8;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = uVar7;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = puVar9;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = pcVar10;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffce0;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffce8;
  CAddress::CAddress((CAddress *)local_b8,ipIn_00,(ServiceFlags)&local_108);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0,__l_00,
             (allocator_type *)&local_2e0);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0,&source,(seconds)0x0);
  ar = (assertion_result *)local_150;
  local_150[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_2c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb64d10;
  local_2c8.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb64d42;
  addr2.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr2.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr2.super_CNetAddr._24_8_ = &local_2c8;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_258 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)&addr2,1,0,WARN,(check_type)puVar9,(size_t)&local_260,0x130);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_1f0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x131;
  file_03.m_begin = (iterator)&local_270;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_280,
             msg_03);
  local_b8[8] = '\0';
  local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_288 = "";
  addr2.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  pCVar5 = &addr2;
  local_150._0_4_ = num_addrs - 1;
  pcVar10 = "num_addrs - collisions";
  uVar7 = 0xb64cd2;
  uVar8 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&local_290,0x131,1);
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)local_150,&num_addrs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 "250.1.1.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
  ResolveService(&addr2,(string *)local_b8,0);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_150);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x134;
  file_04.m_begin = (iterator)&local_2a0;
  msg_04.m_end = (iterator)pCVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2b0,
             msg_04);
  _Var2 = addrman;
  CService::CService(&local_178,&addr2);
  ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar8;
  ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar7;
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = ar;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar10;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffce0;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffce0 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffffce8;
  CAddress::CAddress((CAddress *)local_b8,ipIn_01,(ServiceFlags)&local_178);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_b8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_2c8,__l_01,&local_2c9);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_2c8,&source,
                    (seconds)0x0);
  local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1f0.m_message.px = (element_type *)0x0;
  local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "addrman->Add({CAddress(addr2, NODE_NONE)}, source)";
  local_2d8 = "";
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2e8 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  aStack_140._8_8_ = (allocator_type *)&local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1f0,(lazy_ostream *)local_150,1,0,WARN,(check_type)ar,(size_t)&local_2f0,0x134);
  boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_2c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x135;
  file_05.m_begin = (iterator)&local_300;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_310,
             msg_05);
  local_b8[8] = '\0';
  local_b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_b8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_150._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_1f0._0_4_ = num_addrs - 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_b8,&stack0xfffffffffffffce0,0x135,1,2,local_150,0xb64cd2,&local_1f0,
             "num_addrs - collisions");
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_collisions)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    uint32_t num_addrs{0};

    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);

    while (num_addrs < 22) { // Magic number! 250.1.1.1 - 250.1.1.22 do not collide with deterministic key = 1
        CService addr = ResolveService("250.1.1." + ToString(++num_addrs));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // Test: No collision in new table yet.
        BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);
    }

    // Test: new table collision!
    CService addr1 = ResolveService("250.1.1." + ToString(++num_addrs));
    uint32_t collisions{1};
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);

    CService addr2 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);
}